

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O0

void __thiscall
modified_public_keycase::_impl<picnic_params_t>
          (modified_public_keycase *this,anon_enum_32 *parameters)

{
  bool bVar1;
  undefined4 uVar2;
  long lVar3;
  lazy_ostream *prev;
  uchar *puVar4;
  undefined4 *in_RSI;
  size_t signature_len;
  size_t offset;
  size_t message_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  picnic_privatekey_t sk;
  picnic_publickey_t pk;
  size_t max_signature_size;
  context_frame context_frame_1980;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00001060;
  lazy_ostream *in_stack_fffffffffffffc88;
  lazy_ostream *in_stack_fffffffffffffc90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>
  *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  size_type in_stack_fffffffffffffca8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffcb0;
  undefined1 *puVar5;
  lazy_ostream *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  const_string *in_stack_fffffffffffffcd8;
  const_string *file;
  lazy_ostream *in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffd17;
  value_expr<const_unsigned_long_&> *in_stack_fffffffffffffd18;
  lazy_ostream local_2d8 [2];
  undefined4 local_2b4;
  assertion_result local_2a8;
  basic_cstring<const_char> local_280;
  undefined8 local_270;
  long local_268;
  undefined8 local_260;
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_1b8;
  undefined1 local_1a2 [97];
  undefined1 local_141 [65];
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  lazy_ostream local_e0 [3];
  assertion_result local_b0;
  basic_cstring<const_char> local_88;
  undefined8 local_78;
  undefined8 local_60;
  context_frame local_14;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            (&in_stack_fffffffffffffc98->super_lazy_ostream,(char (*) [16])in_stack_fffffffffffffc90
            );
  local_60 = picnic_get_param_name(*local_10);
  boost::unit_test::operator<<(in_stack_fffffffffffffc98,(char **)in_stack_fffffffffffffc90);
  boost::test_tools::tt_detail::context_frame::context_frame
            ((context_frame *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>,_const_char_*,_const_char_*const_&>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>,_const_char_*,_const_char_*const_&>
              *)0x1d22a9);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> *)
             0x1d22b6);
  bVar1 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&local_14);
  if (bVar1) {
    local_78 = picnic_signature_size(*local_10);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc90);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 (const_string *)in_stack_fffffffffffffcc8);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_fffffffffffffc98,(unsigned_long *)in_stack_fffffffffffffc90);
      boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
                (in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
      in_stack_fffffffffffffce0 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_f0,"max_signature_size",0x12);
      boost::unit_test::operator<<
                (&in_stack_fffffffffffffc98->super_lazy_ostream,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffc90);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_b0,local_e0,&local_100,200,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1d242d);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1d243a);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      file = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc90);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffce0,file,
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 (const_string *)in_stack_fffffffffffffcc8);
      in_stack_fffffffffffffcd4 = picnic_keygen(*local_10,local_141,local_1a2);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_fffffffffffffc98,(bool *)in_stack_fffffffffffffc90);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
      in_stack_fffffffffffffcc8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&stack0xfffffffffffffde8,
                 "!picnic_keygen(parameters, &pk, &sk)",0x24);
      boost::unit_test::operator<<
                (&in_stack_fffffffffffffc98->super_lazy_ostream,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffc90);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_228,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&stack0xfffffffffffffe20,
                 (lazy_ostream *)&stack0xfffffffffffffdf8,&local_228,0xcc,CHECK,
                 CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1d25b0);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1d25bd);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d25dc);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d25e9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    local_260 = 0x200;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>(in_stack_00001060)
    ;
    for (local_268 = 1; local_268 != 0xf; local_268 = local_268 + 1) {
      puVar5 = local_1a2;
      lVar3 = picnic_get_private_key_size(*local_10);
      puVar5[lVar3 - local_268] = puVar5[lVar3 - local_268] ^ 0xff;
    }
    local_270 = local_78;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_280,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc90);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffce0,file,
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 (const_string *)in_stack_fffffffffffffcc8);
      prev = (lazy_ostream *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d2820);
      puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d2832);
      uVar2 = picnic_sign(local_1a2,prev,0x200,puVar4,&local_270);
      local_2b4 = uVar2;
      boost::test_tools::assertion::seed::operator->*((seed *)prev,(int *)in_stack_fffffffffffffc90)
      ;
      boost::test_tools::assertion::value_expr<int>::evaluate
                ((value_expr<int> *)in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
      in_stack_fffffffffffffc90 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&stack0xfffffffffffffd18,
                 "picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len)",
                 0x50);
      boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)in_stack_fffffffffffffc90);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&stack0xfffffffffffffd08,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_2a8,local_2d8,(const_string *)&stack0xfffffffffffffd08,0xdb,CHECK,
                 CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1d2942);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1d294f);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(uVar2,in_stack_fffffffffffffca0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(uVar2,in_stack_fffffffffffffca0));
  }
  boost::test_tools::tt_detail::context_frame::~context_frame((context_frame *)0x1d29e5);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(modified_public_key, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    signature.resize(max_signature_size);

    const size_t message_size = message_inc;
    message.resize(message_size);
    // fill message with some data
    randomize_container(message);

    for (size_t offset = 1; offset != 15; ++offset) {
      sk.data[picnic_get_private_key_size(parameters) - offset] ^= 0xff;
    }

    size_t signature_len = max_signature_size;
    BOOST_TEST(picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
  }
}